

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::CanClearByZeroing(FieldDescriptor *field)

{
  bool bVar1;
  long lVar2;
  byte bVar3;
  
  bVar1 = FieldDescriptor::is_repeated(field);
  if ((bVar1) || (((byte)field[1] & 8) != 0)) {
LAB_001af018:
    return false;
  }
  switch(*(undefined4 *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4)) {
  case 1:
  case 3:
    bVar3 = *(int *)(field + 0x50) == 0;
    break;
  case 2:
  case 4:
    bVar3 = *(long *)(field + 0x50) == 0;
    break;
  case 5:
    bVar1 = *(double *)(field + 0x50) == 0.0;
    goto LAB_001af050;
  case 6:
    bVar1 = *(float *)(field + 0x50) == 0.0;
LAB_001af050:
    bVar3 = -bVar1 & 1;
    break;
  case 7:
    bVar3 = (byte)field[0x50] ^ 1;
    break;
  case 8:
    lVar2 = google::protobuf::FieldDescriptor::default_value_enum();
    bVar3 = *(int *)(lVar2 + 4) == 0;
    break;
  default:
    goto LAB_001af018;
  }
  return (bool)bVar3;
}

Assistant:

bool CanClearByZeroing(const FieldDescriptor* field) {
  if (field->is_repeated() || field->is_extension()) return false;
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_ENUM:
      return field->default_value_enum()->number() == 0;
    case FieldDescriptor::CPPTYPE_INT32:
      return field->default_value_int32() == 0;
    case FieldDescriptor::CPPTYPE_INT64:
      return field->default_value_int64() == 0;
    case FieldDescriptor::CPPTYPE_UINT32:
      return field->default_value_uint32() == 0;
    case FieldDescriptor::CPPTYPE_UINT64:
      return field->default_value_uint64() == 0;
    case FieldDescriptor::CPPTYPE_FLOAT:
      return field->default_value_float() == 0;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return field->default_value_double() == 0;
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() == false;
    default:
      return false;
  }
}